

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
zeGetKernelExpProcAddrTable(ze_api_version_t version,ze_kernel_exp_dditable_t *pDdiTable)

{
  ze_pfnKernelSchedulingHintExp_t p_Var1;
  ze_api_version_t *pzVar2;
  ze_result_t zVar3;
  
  pzVar2 = validation_layer::context;
  if (pDdiTable == (ze_kernel_exp_dditable_t *)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(ze_pfnKernelGetBinaryExp_t *)(validation_layer::context + 0x172) =
           pDdiTable->pfnGetBinaryExp;
      pDdiTable->pfnGetBinaryExp = validation_layer::zeKernelGetBinaryExp;
      p_Var1 = pDdiTable->pfnSchedulingHintExp;
      *(ze_pfnKernelSetGlobalOffsetExp_t *)(pzVar2 + 0x16e) = pDdiTable->pfnSetGlobalOffsetExp;
      *(ze_pfnKernelSchedulingHintExp_t *)(pzVar2 + 0x170) = p_Var1;
      pDdiTable->pfnSetGlobalOffsetExp = validation_layer::zeKernelSetGlobalOffsetExp;
      pDdiTable->pfnSchedulingHintExp = validation_layer::zeKernelSchedulingHintExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_exp_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.KernelExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnSetGlobalOffsetExp                       = pDdiTable->pfnSetGlobalOffsetExp;
    pDdiTable->pfnSetGlobalOffsetExp                     = validation_layer::zeKernelSetGlobalOffsetExp;

    dditable.pfnGetBinaryExp                             = pDdiTable->pfnGetBinaryExp;
    pDdiTable->pfnGetBinaryExp                           = validation_layer::zeKernelGetBinaryExp;

    dditable.pfnSchedulingHintExp                        = pDdiTable->pfnSchedulingHintExp;
    pDdiTable->pfnSchedulingHintExp                      = validation_layer::zeKernelSchedulingHintExp;

    return result;
}